

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O3

void __thiscall
chrono::ChBezierCurve::setPoints
          (ChBezierCurve *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *points,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *inCV,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *outCV)

{
  long lVar1;
  
  lVar1 = (long)(points->
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(points->
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((lVar1 >> 3) * -0x5555555555555555) < 2) {
    __assert_fail("points.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChBezierCurve.cpp"
                  ,0xb3,
                  "void chrono::ChBezierCurve::setPoints(const std::vector<ChVector<>> &, const std::vector<ChVector<>> &, const std::vector<ChVector<>> &)"
                 );
  }
  if (lVar1 == (long)(inCV->
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(inCV->
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) {
    if (lVar1 == (long)(outCV->
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(outCV->
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) {
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
                (&this->m_points,points);
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
                (&this->m_inCV,inCV);
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
                (&this->m_outCV,outCV);
      return;
    }
    __assert_fail("points.size() == outCV.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChBezierCurve.cpp"
                  ,0xb5,
                  "void chrono::ChBezierCurve::setPoints(const std::vector<ChVector<>> &, const std::vector<ChVector<>> &, const std::vector<ChVector<>> &)"
                 );
  }
  __assert_fail("points.size() == inCV.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChBezierCurve.cpp"
                ,0xb4,
                "void chrono::ChBezierCurve::setPoints(const std::vector<ChVector<>> &, const std::vector<ChVector<>> &, const std::vector<ChVector<>> &)"
               );
}

Assistant:

void ChBezierCurve::setPoints(const std::vector<ChVector<> >& points,
                              const std::vector<ChVector<> >& inCV,
                              const std::vector<ChVector<> >& outCV) {
    assert(points.size() > 1);
    assert(points.size() == inCV.size());
    assert(points.size() == outCV.size());
    m_points = points;
    m_inCV = inCV;
    m_outCV = outCV;
}